

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.h
# Opt level: O0

Analysis __thiscall spvtools::opt::StructPackingPass::GetPreservedAnalyses(StructPackingPass *this)

{
  Analysis AVar1;
  StructPackingPass *this_local;
  
  AVar1 = opt::operator|(kAnalysisCombinators,kAnalysisCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisDominatorAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisLoopAnalysis);
  AVar1 = opt::operator|(AVar1,kAnalysisNameMap);
  AVar1 = opt::operator|(AVar1,kAnalysisScalarEvolution);
  AVar1 = opt::operator|(AVar1,kAnalysisStructuredCFG);
  AVar1 = opt::operator|(AVar1,kAnalysisConstants);
  AVar1 = opt::operator|(AVar1,kAnalysisDebugInfo);
  AVar1 = opt::operator|(AVar1,kAnalysisLiveness);
  return AVar1;
}

Assistant:

IRContext::Analysis GetPreservedAnalyses() override {
    return IRContext::kAnalysisCombinators | IRContext::kAnalysisCFG |
           IRContext::kAnalysisDominatorAnalysis |
           IRContext::kAnalysisLoopAnalysis | IRContext::kAnalysisNameMap |
           IRContext::kAnalysisScalarEvolution |
           IRContext::kAnalysisStructuredCFG | IRContext::kAnalysisConstants |
           IRContext::kAnalysisDebugInfo | IRContext::kAnalysisLiveness;
  }